

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_sub_signed_Test::TestBody(correctness_sub_signed_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  big_integer b;
  big_integer a;
  undefined1 in_stack_fffffffffffffd5f;
  undefined2 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd62;
  undefined1 in_stack_fffffffffffffd63;
  undefined1 in_stack_fffffffffffffd64;
  undefined1 in_stack_fffffffffffffd65;
  undefined1 in_stack_fffffffffffffd66;
  string local_298 [4];
  int in_stack_fffffffffffffd6c;
  big_integer *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  big_integer *in_stack_fffffffffffffd80;
  Type in_stack_fffffffffffffd8c;
  AssertHelper *in_stack_fffffffffffffd90;
  big_integer *in_stack_fffffffffffffdb8;
  big_integer *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd8;
  AssertHelper *in_stack_fffffffffffffde0;
  string local_1e8 [104];
  AssertionResult local_180;
  string local_170 [216];
  AssertionResult local_98 [9];
  
  big_integer::big_integer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  big_integer::big_integer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  big_integer::big_integer
            (in_stack_fffffffffffffd80,
             (big_integer *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  ::operator-((big_integer *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
              in_stack_fffffffffffffd70);
  big_integer::big_integer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  uVar1 = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd70);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffd66,
                                     CONCAT15(in_stack_fffffffffffffd65,
                                              CONCAT14(in_stack_fffffffffffffd64,
                                                       CONCAT13(in_stack_fffffffffffffd63,
                                                                CONCAT12(in_stack_fffffffffffffd62,
                                                                         in_stack_fffffffffffffd60))
                                                      )))),(bool)in_stack_fffffffffffffd5f);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffd66,
                                     CONCAT15(in_stack_fffffffffffffd65,
                                              CONCAT14(in_stack_fffffffffffffd64,
                                                       CONCAT13(in_stack_fffffffffffffd63,
                                                                CONCAT12(in_stack_fffffffffffffd62,
                                                                         in_stack_fffffffffffffd60))
                                                      )))));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffd66,
                                     CONCAT15(in_stack_fffffffffffffd65,
                                              CONCAT14(in_stack_fffffffffffffd64,
                                                       CONCAT13(in_stack_fffffffffffffd63,
                                                                CONCAT12(in_stack_fffffffffffffd62,
                                                                         in_stack_fffffffffffffd60))
                                                      )))));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffd66,
                                     CONCAT15(in_stack_fffffffffffffd65,
                                              CONCAT14(in_stack_fffffffffffffd64,
                                                       CONCAT13(in_stack_fffffffffffffd63,
                                                                CONCAT12(in_stack_fffffffffffffd62,
                                                                         in_stack_fffffffffffffd60))
                                                      )))));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffdd8.ptr_,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->sign);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,&in_stack_fffffffffffffd80->sign,
               in_stack_fffffffffffffd7c,&in_stack_fffffffffffffd70->sign);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffde0,(Message *)in_stack_fffffffffffffdd8.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffd65,
                                                      CONCAT14(in_stack_fffffffffffffd64,
                                                               CONCAT13(in_stack_fffffffffffffd63,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd62,
                                                  in_stack_fffffffffffffd60)))))));
    std::__cxx11::string::~string(local_170);
    testing::Message::~Message((Message *)0x115d9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115e1a);
  big_integer::operator-=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  big_integer::big_integer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  uVar3 = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd70);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffd64,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd63,
                                                  CONCAT12(in_stack_fffffffffffffd62,
                                                           in_stack_fffffffffffffd60)))))),
             (bool)in_stack_fffffffffffffd5f);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffd64,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd63,
                                                  CONCAT12(in_stack_fffffffffffffd62,
                                                           in_stack_fffffffffffffd60)))))));
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffdd8.ptr_,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->sign);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,&in_stack_fffffffffffffd80->sign,
               in_stack_fffffffffffffd7c,&in_stack_fffffffffffffd70->sign);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffde0,(Message *)in_stack_fffffffffffffdd8.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  in_stack_fffffffffffffd63,
                                                  CONCAT12(in_stack_fffffffffffffd62,
                                                           in_stack_fffffffffffffd60)))))));
    std::__cxx11::string::~string(local_1e8);
    testing::Message::~Message((Message *)0x115fa2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11601d);
  big_integer::big_integer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  big_integer::operator-=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  in_stack_fffffffffffffd63,
                                                  CONCAT12(in_stack_fffffffffffffd62,
                                                           in_stack_fffffffffffffd60)))))));
  big_integer::big_integer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  uVar5 = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd70);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd62,
                                                  in_stack_fffffffffffffd60)))))),
             (bool)in_stack_fffffffffffffd5f);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd62,
                                                  in_stack_fffffffffffffd60)))))));
  uVar6 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdd0);
  if (!(bool)uVar6) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffdd8.ptr_,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->sign);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,&in_stack_fffffffffffffd80->sign,
               in_stack_fffffffffffffd7c,&in_stack_fffffffffffffd70->sign);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffde0,(Message *)in_stack_fffffffffffffdd8.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  uVar6,in_stack_fffffffffffffd60)))))));
    std::__cxx11::string::~string(local_298);
    testing::Message::~Message((Message *)0x1161bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116228);
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  uVar6,in_stack_fffffffffffffd60)))))));
  big_integer::~big_integer
            ((big_integer *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(uVar5,CONCAT12(
                                                  uVar6,in_stack_fffffffffffffd60)))))));
  return;
}

Assistant:

TEST(correctness, sub_signed)
{
    big_integer a = 5;
    big_integer b = 20;

    EXPECT_TRUE(a - b == -15);

    a -= b;
    EXPECT_TRUE(a == -15);

    a -= -100;
    EXPECT_TRUE(a == 85);
}